

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-bst.c
# Opt level: O3

pboolean p_tree_bst_remove(PTreeBaseNode **root_node,PCompareDataFunc compare_func,ppointer data,
                          PDestroyFunc key_destroy_func,PDestroyFunc value_destroy_func,
                          pconstpointer key)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  PTreeBaseNode *pPVar4;
  pint pVar5;
  PTreeBaseNode_ *pPVar6;
  PTreeBaseNode_ *pPVar7;
  PTreeBaseNode *mem;
  
  pPVar4 = *root_node;
  do {
    mem = pPVar4;
    if (mem == (PTreeBaseNode *)0x0) {
      return 0;
    }
    pVar5 = (*compare_func)(key,mem->key,data);
    if (-1 < pVar5) {
      if (pVar5 == 0) {
        pPVar7 = mem->left;
        if (pPVar7 == (PTreeBaseNode_ *)0x0) goto LAB_0010a91f;
        pPVar4 = mem;
        if (mem->right != (PTreeBaseNode_ *)0x0) {
          do {
            root_node = &pPVar4->left;
            pPVar6 = pPVar7;
            pPVar7 = pPVar6->right;
            pPVar4 = (PTreeBaseNode *)&pPVar6->right;
          } while (pPVar6->right != (PTreeBaseNode_ *)0x0);
          uVar1 = *(undefined4 *)((long)&pPVar6->key + 4);
          uVar2 = *(undefined4 *)&pPVar6->value;
          uVar3 = *(undefined4 *)((long)&pPVar6->value + 4);
          *(undefined4 *)&mem->key = *(undefined4 *)&pPVar6->key;
          *(undefined4 *)((long)&mem->key + 4) = uVar1;
          *(undefined4 *)&mem->value = uVar2;
          *(undefined4 *)((long)&mem->value + 4) = uVar3;
          pPVar7 = pPVar6->left;
          mem = pPVar6;
          if (pPVar7 == (PTreeBaseNode_ *)0x0) {
LAB_0010a91f:
            pPVar7 = mem->right;
          }
        }
        ((PTreeBaseNode *)root_node)->left = pPVar7;
        if (key_destroy_func != (PDestroyFunc)0x0) {
          (*key_destroy_func)(mem->key);
        }
        if (value_destroy_func != (PDestroyFunc)0x0) {
          (*value_destroy_func)(mem->value);
        }
        p_free(mem);
        return 1;
      }
      mem = (PTreeBaseNode *)&mem->right;
    }
    pPVar4 = mem->left;
    root_node = &mem->left;
  } while( true );
}

Assistant:

pboolean
p_tree_bst_remove (PTreeBaseNode	**root_node,
		   PCompareDataFunc	compare_func,
		   ppointer		data,
		   PDestroyFunc		key_destroy_func,
		   PDestroyFunc		value_destroy_func,
		   pconstpointer	key)
{
	PTreeBaseNode	*cur_node;
	PTreeBaseNode	*prev_node;
	PTreeBaseNode	**node_pointer;
	pint		cmp_result;

	cur_node     = *root_node;
	node_pointer = root_node;

	while (cur_node != NULL) {
		cmp_result = compare_func (key, cur_node->key, data);

		if (cmp_result < 0) {
			node_pointer = &cur_node->left;
			cur_node     = cur_node->left;
		} else if (cmp_result > 0) {
			node_pointer = &cur_node->right;
			cur_node     = cur_node->right;
		} else
			break;
	}

	if (P_UNLIKELY (cur_node == NULL))
		return FALSE;

	if (cur_node->left != NULL && cur_node->right != NULL) {
		node_pointer = &cur_node->left;
		prev_node    = cur_node->left;

		while (prev_node->right != NULL) {
			node_pointer = &prev_node->right;
			prev_node    = prev_node->right;
		}

		cur_node->key   = prev_node->key;
		cur_node->value = prev_node->value;

		cur_node = prev_node;
	}

	*node_pointer = cur_node->left == NULL ? cur_node->right : cur_node->left;

	if (key_destroy_func != NULL)
		key_destroy_func (cur_node->key);

	if (value_destroy_func != NULL)
		value_destroy_func (cur_node->value);

	p_free (cur_node);

	return TRUE;
}